

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

AActor * SpawnMapThing(int index,FMapThing *mt,int position)

{
  double dVar1;
  double dVar2;
  double dVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  AActor *ac;
  undefined4 extraout_var;
  char *pcVar7;
  
  ac = P_SpawnMapThing(mt,position);
  if (dumpspawnedthings.Value == true) {
    dVar1 = (mt->pos).X;
    dVar2 = (mt->pos).Y;
    dVar3 = (mt->pos).Z;
    sVar4 = mt->EdNum;
    uVar5 = mt->flags;
    if (ac == (AActor *)0x0) {
      pcVar7 = "(none)";
    }
    else {
      if ((ac->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar6 = (**(ac->super_DThinker).super_DObject._vptr_DObject)(ac);
        (ac->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
      }
      pcVar7 = FName::NameData.NameArray
               [(((ac->super_DThinker).super_DObject.Class)->super_PNativeStruct).super_PStruct.
                super_PNamedType.TypeName.Index].Text;
    }
    Printf("%5d: (%5f, %5f, %5f), doomednum = %5d, flags = %04x, type = %s\n",dVar1,dVar2,dVar3,
           index,(ulong)(uint)(int)sVar4,(ulong)uVar5,pcVar7);
  }
  T_AddSpawnedThing(ac);
  return ac;
}

Assistant:

AActor *SpawnMapThing(int index, FMapThing *mt, int position)
{
	AActor *spawned = P_SpawnMapThing(mt, position);
	if (dumpspawnedthings)
	{
		Printf("%5d: (%5f, %5f, %5f), doomednum = %5d, flags = %04x, type = %s\n",
			index, mt->pos.X, mt->pos.Y, mt->pos.Z, mt->EdNum, mt->flags, 
			spawned? spawned->GetClass()->TypeName.GetChars() : "(none)");
	}
	T_AddSpawnedThing(spawned);
	return spawned;
}